

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCDecoder.cpp
# Opt level: O0

void ZXing::MaxiCode::DecodedBitStreamParser::GetMessage
               (ByteArray *bytes,int start,int len,Content *result,StructuredAppendInfo *sai)

{
  string *str;
  const_reference pvVar1;
  byte *pbVar2;
  Content *in_RCX;
  Content *this;
  int in_EDX;
  int in_ESI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  int in_stack_00000018;
  int in_stack_0000001c;
  int c;
  int i;
  int lastset;
  int set;
  int shift;
  ECI in_stack_ffffffffffffff5c;
  Content *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  string local_58 [36];
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  Content *local_18;
  int local_10;
  int local_c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_8;
  
  local_24 = -1;
  local_28 = 0;
  local_2c = 0;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  for (local_30 = in_ESI; local_30 < local_c + local_10; local_30 = local_30 + 1) {
    str = (string *)(CHARSETS + (long)local_28 * 0x80);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,(long)local_30);
    pvVar1 = std::array<short,_64UL>::at
                       ((array<short,_64UL> *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    local_34 = (int)*pvVar1;
    this = (Content *)(ulong)(local_34 - 0x100);
    switch(this) {
    case (Content *)0x0:
    case (Content *)0x1:
    case (Content *)0x2:
    case (Content *)0x3:
    case (Content *)0x4:
      local_2c = local_28;
      local_28 = local_34 + -0x100;
      local_24 = 1;
      break;
    case (Content *)0x5:
      local_2c = local_28;
      local_28 = 0;
      local_24 = 2;
      break;
    case (Content *)0x6:
      local_2c = local_28;
      local_28 = 0;
      local_24 = 3;
      break;
    case (Content *)0x7:
      local_28 = 0;
      local_24 = -1;
      break;
    case (Content *)0x8:
      local_28 = 1;
      local_24 = -1;
      break;
    case (Content *)0x9:
      local_24 = -1;
      break;
    case (Content *)0xa:
      in_stack_ffffffffffffff60 = local_18;
      ParseECIValue((ByteArray *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                    (int *)local_18);
      Content::switchEncoding(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      break;
    case (Content *)0xb:
      pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (local_8,(long)(local_30 + 1));
      in_stack_ffffffffffffff68 = (uint)*pbVar2 << 0x18;
      pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (local_8,(long)(local_30 + 2));
      in_stack_ffffffffffffff6c = in_stack_ffffffffffffff68 + (uint)*pbVar2 * 0x40000;
      pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (local_8,(long)(local_30 + 3));
      in_stack_ffffffffffffff70 = in_stack_ffffffffffffff6c + (uint)*pbVar2 * 0x1000;
      pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (local_8,(long)(local_30 + 4));
      in_stack_ffffffffffffff74 = in_stack_ffffffffffffff70 + (uint)*pbVar2 * 0x40;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                (local_8,(long)(local_30 + 5));
      ToString<int,void>(in_stack_0000001c,in_stack_00000018);
      Content::append(this,str);
      std::__cxx11::string::~string(local_58);
      local_30 = local_30 + 5;
      break;
    case (Content *)0xc:
      if (local_30 == local_c) {
        ParseStructuredAppend
                  ((ByteArray *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   (int *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   (StructuredAppendInfo *)in_stack_ffffffffffffff60);
      }
      local_24 = -1;
      break;
    default:
      Content::push_back(in_stack_ffffffffffffff60,
                         (uint8_t)((uint)in_stack_ffffffffffffff5c >> 0x18));
    }
    if (local_24 == 0) {
      local_28 = local_2c;
    }
    local_24 = local_24 + -1;
  }
  return;
}

Assistant:

static void GetMessage(const ByteArray& bytes, int start, int len, Content& result, StructuredAppendInfo& sai)
{
	int shift = -1;
	int set = 0;
	int lastset = 0;

	for (int i = start; i < start + len; i++) {
		int c = CHARSETS[set].at(bytes[i]);
		switch (c) {
		case LCHA:
			set   = 0;
			shift = -1;
			break;
		case LCHB:
			set   = 1;
			shift = -1;
			break;
		case SHI0:
		case SHI1:
		case SHI2:
		case SHI3:
		case SHI4:
			lastset = set;
			set     = c - SHI0;
			shift   = 1;
			break;
		case TWSA:
			lastset = set;
			set     = 0;
			shift   = 2;
			break;
		case TRSA:
			lastset = set;
			set     = 0;
			shift   = 3;
			break;
		case NS:
			result.append(
				ToString((bytes[i + 1] << 24) + (bytes[i + 2] << 18) + (bytes[i + 3] << 12) + (bytes[i + 4] << 6) + bytes[i + 5], 9));
			i += 5;
			break;
		case LOCK: shift = -1; break;
		case ECI: result.switchEncoding(ParseECIValue(bytes, i)); break;
		case PAD:
			if (i == start)
				ParseStructuredAppend(bytes, i, sai);
			shift = -1;
			break;
		default: result.push_back(c);
		}

		if (shift-- == 0)
			set = lastset;
	}
}